

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_smax64_s390x(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  long local_58;
  int64_t dd;
  int64_t bb;
  int64_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (aa = 0; aa < oprsz_00; aa = aa + 8) {
    local_58 = *(long *)((long)b + aa);
    if (local_58 < *(long *)((long)a + aa)) {
      local_58 = *(long *)((long)a + aa);
    }
    *(long *)((long)d + aa) = local_58;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_smax64)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int64_t)) {
        int64_t aa = *(int64_t *)((char *)a + i);
        int64_t bb = *(int64_t *)((char *)b + i);
        int64_t dd = aa > bb ? aa : bb;
        *(int64_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}